

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int hasHotJournal(Pager *pPager,int *pExists)

{
  int iVar1;
  char local_39;
  int local_38;
  Pgno PStack_34;
  u8 first;
  int f;
  Pgno nPage;
  int locked;
  int jrnlOpen;
  int exists;
  int rc;
  sqlite3_vfs *pVfs;
  int *pExists_local;
  Pager *pPager_local;
  
  _exists = pPager->pVfs;
  jrnlOpen = 0;
  locked = 1;
  nPage = (Pgno)(pPager->jfd->pMethods != (sqlite3_io_methods *)0x0);
  *pExists = 0;
  pVfs = (sqlite3_vfs *)pExists;
  pExists_local = (int *)pPager;
  if (nPage == 0) {
    jrnlOpen = sqlite3OsAccess(_exists,pPager->zJournal,0,&locked);
  }
  if ((jrnlOpen == 0) && (locked != 0)) {
    f = 0;
    jrnlOpen = sqlite3OsCheckReservedLock(*(sqlite3_file **)(pExists_local + 0x12),&f);
    if ((jrnlOpen == 0) &&
       ((f == 0 &&
        (jrnlOpen = pagerPagecount((Pager *)pExists_local,&stack0xffffffffffffffcc), jrnlOpen == 0))
       )) {
      if (PStack_34 == 0) {
        sqlite3BeginBenignMalloc();
        iVar1 = pagerLockDb((Pager *)pExists_local,2);
        if ((iVar1 == 0) &&
           (sqlite3OsDelete(_exists,*(char **)(pExists_local + 0x36),0),
           (char)pExists_local[2] == '\0')) {
          pagerUnlockDb((Pager *)pExists_local,1);
        }
        sqlite3EndBenignMalloc();
      }
      else {
        if (nPage == 0) {
          local_38 = 0x801;
          jrnlOpen = sqlite3OsOpen(_exists,*(char **)(pExists_local + 0x36),
                                   *(sqlite3_file **)(pExists_local + 0x14),0x801,&local_38);
        }
        if (jrnlOpen == 0) {
          local_39 = '\0';
          jrnlOpen = sqlite3OsRead(*(sqlite3_file **)(pExists_local + 0x14),&local_39,1,0);
          if (jrnlOpen == 0x20a) {
            jrnlOpen = 0;
          }
          if (nPage == 0) {
            sqlite3OsClose(*(sqlite3_file **)(pExists_local + 0x14));
          }
          pVfs->iVersion = (uint)(local_39 != '\0');
        }
        else if (jrnlOpen == 0xe) {
          pVfs->iVersion = 1;
          jrnlOpen = 0;
        }
      }
    }
  }
  return jrnlOpen;
}

Assistant:

static int hasHotJournal(Pager *pPager, int *pExists){
  sqlite3_vfs * const pVfs = pPager->pVfs;
  int rc = SQLITE_OK;           /* Return code */
  int exists = 1;               /* True if a journal file is present */
  int jrnlOpen = !!isOpen(pPager->jfd);

  assert( pPager->useJournal );
  assert( isOpen(pPager->fd) );
  assert( pPager->eState==PAGER_OPEN );

  assert( jrnlOpen==0 || ( sqlite3OsDeviceCharacteristics(pPager->jfd) &
    SQLITE_IOCAP_UNDELETABLE_WHEN_OPEN
  ));

  *pExists = 0;
  if( !jrnlOpen ){
    rc = sqlite3OsAccess(pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &exists);
  }
  if( rc==SQLITE_OK && exists ){
    int locked = 0;             /* True if some process holds a RESERVED lock */

    /* Race condition here:  Another process might have been holding the
    ** the RESERVED lock and have a journal open at the sqlite3OsAccess() 
    ** call above, but then delete the journal and drop the lock before
    ** we get to the following sqlite3OsCheckReservedLock() call.  If that
    ** is the case, this routine might think there is a hot journal when
    ** in fact there is none.  This results in a false-positive which will
    ** be dealt with by the playback routine.  Ticket #3883.
    */
    rc = sqlite3OsCheckReservedLock(pPager->fd, &locked);
    if( rc==SQLITE_OK && !locked ){
      Pgno nPage;                 /* Number of pages in database file */

      /* Check the size of the database file. If it consists of 0 pages,
      ** then delete the journal file. See the header comment above for 
      ** the reasoning here.  Delete the obsolete journal file under
      ** a RESERVED lock to avoid race conditions and to avoid violating
      ** [H33020].
      */
      rc = pagerPagecount(pPager, &nPage);
      if( rc==SQLITE_OK ){
        if( nPage==0 ){
          sqlite3BeginBenignMalloc();
          if( pagerLockDb(pPager, RESERVED_LOCK)==SQLITE_OK ){
            sqlite3OsDelete(pVfs, pPager->zJournal, 0);
            if( !pPager->exclusiveMode ) pagerUnlockDb(pPager, SHARED_LOCK);
          }
          sqlite3EndBenignMalloc();
        }else{
          /* The journal file exists and no other connection has a reserved
          ** or greater lock on the database file. Now check that there is
          ** at least one non-zero bytes at the start of the journal file.
          ** If there is, then we consider this journal to be hot. If not, 
          ** it can be ignored.
          */
          if( !jrnlOpen ){
            int f = SQLITE_OPEN_READONLY|SQLITE_OPEN_MAIN_JOURNAL;
            rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &f);
          }
          if( rc==SQLITE_OK ){
            u8 first = 0;
            rc = sqlite3OsRead(pPager->jfd, (void *)&first, 1, 0);
            if( rc==SQLITE_IOERR_SHORT_READ ){
              rc = SQLITE_OK;
            }
            if( !jrnlOpen ){
              sqlite3OsClose(pPager->jfd);
            }
            *pExists = (first!=0);
          }else if( rc==SQLITE_CANTOPEN ){
            /* If we cannot open the rollback journal file in order to see if
            ** its has a zero header, that might be due to an I/O error, or
            ** it might be due to the race condition described above and in
            ** ticket #3883.  Either way, assume that the journal is hot.
            ** This might be a false positive.  But if it is, then the
            ** automatic journal playback and recovery mechanism will deal
            ** with it under an EXCLUSIVE lock where we do not need to
            ** worry so much with race conditions.
            */
            *pExists = 1;
            rc = SQLITE_OK;
          }
        }
      }
    }
  }

  return rc;
}